

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::fulfill
          (Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this,
          FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *value)

{
  bool bVar1;
  OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *value_00;
  ExceptionOr<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> local_1f8;
  OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError> *local_18;
  FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *value_local;
  Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
                this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>>(local_18);
    ExceptionOr<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::ExceptionOr
              (&local_1f8,value_00);
    ExceptionOr<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::operator=
              (&this->result,&local_1f8);
    ExceptionOr<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::~ExceptionOr
              (&local_1f8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }